

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lefreader.cpp
# Opt level: O1

bool __thiscall LEFReader::parseViaRule(LEFReader *this)

{
  string *tokstr;
  size_t __n;
  token_t tVar1;
  int iVar2;
  bool bVar3;
  string viaRuleName;
  string local_68;
  undefined1 *local_48;
  size_t local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  tokstr = &this->m_tokstr;
  tVar1 = tokenize(this,tokstr);
  this->m_curtok = tVar1;
  local_40 = 0;
  local_38 = 0;
  local_48 = &local_38;
  if (tVar1 == TOK_IDENT) {
    std::__cxx11::string::_M_assign((string *)&local_48);
    do {
      do {
        tVar1 = tokenize(this,tokstr);
        while( true ) {
          this->m_curtok = tVar1;
          iVar2 = std::__cxx11::string::compare((char *)tokstr);
          if (iVar2 == 0) break;
          tVar1 = tokenize(this,tokstr);
        }
        tVar1 = tokenize(this,tokstr);
        this->m_curtok = tVar1;
        if (tVar1 != TOK_IDENT) {
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_68,"Expected viarule name after END\n","");
          error(this,&local_68);
          goto LAB_0012bd79;
        }
        __n = (this->m_tokstr)._M_string_length;
        if (__n != local_40) goto LAB_0012bcdd;
      } while (__n == 0);
      iVar2 = bcmp((tokstr->_M_dataplus)._M_p,local_48,__n);
    } while (iVar2 == 0);
LAB_0012bcdd:
    tVar1 = tokenize(this,tokstr);
    this->m_curtok = tVar1;
    bVar3 = true;
    if (tVar1 == TOK_EOL) goto LAB_0012bd91;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Expected EOL after END <viarule name>\n","");
    error(this,&local_68);
  }
  else {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Expected identifier in viarule name\n","");
    error(this,&local_68);
  }
LAB_0012bd79:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  bVar3 = false;
LAB_0012bd91:
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  return bVar3;
}

Assistant:

bool LEFReader::parseViaRule()
{
    // VIARULE <vianame> ...
    // keep on reading tokens until we
    // find END <vianame>

    m_curtok = tokenize(m_tokstr);
    std::string viaRuleName;

    if (m_curtok != TOK_IDENT)
    {
        error("Expected identifier in viarule name\n");
        return false;
    }

    viaRuleName = m_tokstr;

    // read until we get END <vianame>
    do
    {
        m_curtok = tokenize(m_tokstr);
        while(m_tokstr != "END")
        {
            m_curtok = tokenize(m_tokstr);
        }

        // read via name
        m_curtok = tokenize(m_tokstr);
        if (m_curtok != TOK_IDENT)
        {
            error("Expected viarule name after END\n");
            return false;
        }
    } while(m_tokstr == viaRuleName);
    
    m_curtok = tokenize(m_tokstr);
    if (m_curtok != TOK_EOL)
    {
        error("Expected EOL after END <viarule name>\n");
        return false;
    }

    return true;
}